

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.cpp
# Opt level: O2

void __thiscall Priority_queue::pop(Priority_queue *this)

{
  double dVar1;
  int iVar2;
  pointer pdVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  
  iVar2 = this->currentsize;
  lVar6 = (long)iVar2;
  if (lVar6 == 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"This priority queue is empty!");
    std::endl<char,std::char_traits<char>>(poVar8);
    return;
  }
  uVar7 = lVar6 - 1;
  this->currentsize = (uint)uVar7;
  pdVar3 = (this->PriQueue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar3[lVar6];
  uVar9 = 1;
  while( true ) {
    iVar4 = (int)uVar9;
    uVar5 = iVar4 * 2;
    if (iVar2 <= (int)uVar5) break;
    uVar9 = uVar7 & 0xffffffff;
    uVar10 = uVar7;
    if (uVar5 != (uint)uVar7) {
      uVar11 = uVar5 | 1;
      uVar9 = (ulong)uVar5;
      uVar10 = (long)(int)uVar5;
      if (pdVar3[(int)uVar5] <= pdVar3[(int)uVar11] && pdVar3[(int)uVar11] != pdVar3[(int)uVar5]) {
        uVar9 = (ulong)uVar11;
        uVar10 = (long)(int)uVar11;
      }
    }
    if (pdVar3[uVar10] <= dVar1) break;
    pdVar3[iVar4] = pdVar3[uVar10];
  }
  pdVar3[iVar4] = dVar1;
  return;
}

Assistant:

void Priority_queue::pop() {
    if (empty())
        cout << "This priority queue is empty!" << endl;
    else {
        int i, child; //child是i的子结点序号
        T temp = PriQueue[currentsize--]; //将最后一个位置的值储存
        for (i = 1; i * 2 <= currentsize; i = child) {
            child = i * 2;
            if (child != currentsize && PriQueue[child] < PriQueue[child + 1]) //选择大的子结点
                child++;
            if (temp < PriQueue[child]) //下虑，把空位置下移
                PriQueue[i] = PriQueue[child];
            else
                break;
        }
        PriQueue[i] = temp;
    }
}